

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_1564198::HandleCompareCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  pointer pbVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  cmMakefile *this;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  string e;
  string e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined8 local_60;
  char *local_58;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"sub-command COMPARE requires a mode to be specified.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_50.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return false;
    }
LAB_003bbe31:
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    return false;
  }
  __rhs = pbVar1 + 1;
  iVar5 = std::__cxx11::string::compare((char *)__rhs);
  if ((((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 != 0)) &&
      (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 != 0)) &&
     (((iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 != 0 &&
       (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 != 0)) &&
      (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 != 0)))) {
    std::operator+(&local_80,"sub-command COMPARE does not recognize mode ",__rhs);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_50.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return false;
    }
    goto LAB_003bbe31;
  }
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
    local_80.field_2._8_8_ = pbVar1[1]._M_dataplus._M_p;
    local_80.field_2._M_allocated_capacity = pbVar1[1]._M_string_length;
    local_80._M_dataplus._M_p = (pointer)0x1a;
    local_80._M_string_length = 0x77a77a;
    local_60 = 0x2d;
    local_58 = " needs at least 5 arguments total to command.";
    views._M_len = 3;
    views._M_array = (iterator)&local_80;
    cmCatViews_abi_cxx11_(&local_50,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return false;
    }
    goto LAB_003bbe31;
  }
  __lhs = pbVar2 + 2;
  iVar5 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar5 == 0) {
    iVar5 = std::__cxx11::string::compare((string *)__lhs);
    if (-1 < iVar5) goto LAB_003bbed2;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar5 == 0) {
      iVar5 = std::__cxx11::string::compare((string *)__lhs);
      if (0 < iVar5) goto LAB_003bbed2;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar5 == 0) {
        iVar5 = std::__cxx11::string::compare((string *)__lhs);
        if (iVar5 < 1) goto LAB_003bbed2;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar5 == 0) {
          bVar4 = std::operator>=(__lhs,pbVar2 + 3);
          if (!bVar4) goto LAB_003bbed2;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)__rhs);
          _Var3 = std::operator==(__lhs,pbVar2 + 3);
          if (_Var3 != (iVar5 == 0)) {
LAB_003bbed2:
            this = status->Makefile;
            pcVar6 = "0";
            goto LAB_003bbf08;
          }
        }
      }
    }
  }
  this = status->Makefile;
  pcVar6 = "1";
LAB_003bbf08:
  value._M_str = pcVar6;
  value._M_len = 1;
  cmMakefile::AddDefinition(this,pbVar2 + 4,value);
  return true;
}

Assistant:

bool HandleCompareCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command COMPARE requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if ((mode == "EQUAL") || (mode == "NOTEQUAL") || (mode == "LESS") ||
      (mode == "LESS_EQUAL") || (mode == "GREATER") ||
      (mode == "GREATER_EQUAL")) {
    if (args.size() < 5) {
      std::string e =
        cmStrCat("sub-command COMPARE, mode ", mode,
                 " needs at least 5 arguments total to command.");
      status.SetError(e);
      return false;
    }

    const std::string& left = args[2];
    const std::string& right = args[3];
    const std::string& outvar = args[4];
    bool result;
    if (mode == "LESS") {
      result = (left < right);
    } else if (mode == "LESS_EQUAL") {
      result = (left <= right);
    } else if (mode == "GREATER") {
      result = (left > right);
    } else if (mode == "GREATER_EQUAL") {
      result = (left >= right);
    } else if (mode == "EQUAL") {
      result = (left == right);
    } else // if(mode == "NOTEQUAL")
    {
      result = !(left == right);
    }
    if (result) {
      status.GetMakefile().AddDefinition(outvar, "1");
    } else {
      status.GetMakefile().AddDefinition(outvar, "0");
    }
    return true;
  }
  std::string e = "sub-command COMPARE does not recognize mode " + mode;
  status.SetError(e);
  return false;
}